

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq.c
# Opt level: O3

int nn_xreq_create(void *hint,nn_sockbase **sockbase)

{
  int extraout_EAX;
  nn_sockbase *self;
  nn_sockbase *self_00;
  
  self_00 = (nn_sockbase *)0x320;
  self = (nn_sockbase *)nn_alloc_(800);
  if (self != (nn_sockbase *)0x0) {
    nn_sockbase_init(self,&nn_xreq_sockbase_vfptr,hint);
    nn_lb_init((nn_lb *)(self + 1));
    nn_fq_init((nn_fq *)&self[0x19].sock);
    *sockbase = self;
    return 0;
  }
  nn_xreq_create_cold_1();
  nn_fq_term((nn_fq *)&self_00[0x19].sock);
  nn_lb_term((nn_lb *)(self_00 + 1));
  nn_sockbase_term(self_00);
  nn_free(self_00);
  return extraout_EAX;
}

Assistant:

static int nn_xreq_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_xreq *self;

    self = nn_alloc (sizeof (struct nn_xreq), "socket (xreq)");
    alloc_assert (self);
    nn_xreq_init (self, &nn_xreq_sockbase_vfptr, hint);
    *sockbase = &self->sockbase;

    return 0;
}